

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Try.h
# Opt level: O3

void __thiscall
async_simple::Try<std::pair<std::error_code,_unsigned_long>_>::setException
          (Try<std::pair<std::error_code,_unsigned_long>_> *this,exception_ptr *error)

{
  variant_alternative_t<2UL,_variant<monostate,_pair<error_code,_unsigned_long>,_exception_ptr>_>
  *pvVar1;
  
  if (*(__index_type *)
       ((long)&(this->_value).
               super__Variant_base<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
               .
               super__Move_assign_alias<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
               .
               super__Copy_assign_alias<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
               .
               super__Move_ctor_alias<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
               .
               super__Copy_ctor_alias<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
               .
               super__Variant_storage_alias<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
       + 0x18) == '\x02') {
    pvVar1 = std::
             get<2ul,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                       (&this->_value);
    if (pvVar1->_M_exception_object == error->_M_exception_object) {
      return;
    }
  }
  std::
  variant<std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
  ::emplace<2ul,std::__exception_ptr::exception_ptr&>
            ((variant<std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
              *)this,error);
  return;
}

Assistant:

void setException(std::exception_ptr error) {
        if (std::holds_alternative<std::exception_ptr>(_value) &&
            std::get<std::exception_ptr>(_value) == error) {
            return;
        }
        _value.template emplace<std::exception_ptr>(error);
    }